

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O0

void __thiscall
libmatroska::KaxCuePoint::PositionSet
          (KaxCuePoint *this,KaxBlockBlob *BlobReference,uint64 GlobalTimecodeScale)

{
  bool bVar1;
  uint16 uVar2;
  KaxInternalBlock *this_00;
  EbmlUInteger *pEVar3;
  uint64 uVar4;
  EbmlMaster *Master;
  KaxBlockGroup *this_01;
  EbmlElement *this_02;
  KaxCluster *this_03;
  KaxSegment *this_04;
  KaxCueCodecState *CueCodecState;
  KaxCodecState *CodecState;
  KaxBlockGroup *BlockGroup;
  KaxCueClusterPosition *TheClustPos;
  KaxCueTrack *TheTrack;
  KaxCueTrackPositions *NewPositions;
  KaxCueTime *NewTime;
  KaxInternalBlock *BlockReference;
  uint64 GlobalTimecodeScale_local;
  KaxBlockBlob *BlobReference_local;
  KaxCuePoint *this_local;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlobReference);
  pEVar3 = &libebml::GetChild<libmatroska::KaxCueTime>(&this->super_EbmlMaster)->super_EbmlUInteger;
  uVar4 = KaxInternalBlock::GlobalTimecode(this_00);
  libebml::EbmlUInteger::operator=(pEVar3,uVar4 / GlobalTimecodeScale);
  Master = &libebml::AddNewChild<libmatroska::KaxCueTrackPositions>(&this->super_EbmlMaster)->
            super_EbmlMaster;
  pEVar3 = &libebml::GetChild<libmatroska::KaxCueTrack>(Master)->super_EbmlUInteger;
  uVar2 = KaxInternalBlock::TrackNum(this_00);
  libebml::EbmlUInteger::operator=(pEVar3,(ulong)uVar2);
  pEVar3 = &libebml::GetChild<libmatroska::KaxCueClusterPosition>(Master)->super_EbmlUInteger;
  uVar4 = KaxInternalBlock::ClusterPosition(this_00);
  libebml::EbmlUInteger::operator=(pEVar3,uVar4);
  bVar1 = KaxBlockBlob::IsSimpleBlock(BlobReference);
  if (!bVar1) {
    this_01 = KaxBlockBlob::operator_cast_to_KaxBlockGroup_(BlobReference);
    this_02 = libebml::EbmlMaster::FindFirstElt
                        (&this_01->super_EbmlMaster,(EbmlCallbacks *)KaxCodecState::ClassInfos);
    if (this_02 != (EbmlElement *)0x0) {
      pEVar3 = &libebml::AddNewChild<libmatroska::KaxCueCodecState>(Master)->super_EbmlUInteger;
      this_03 = KaxBlockGroup::GetParentCluster(this_01);
      this_04 = KaxCluster::GetParentSegment(this_03);
      uVar4 = libebml::EbmlElement::GetElementPosition(this_02);
      uVar4 = KaxSegment::GetRelativePosition(this_04,uVar4);
      libebml::EbmlUInteger::operator=(pEVar3,uVar4);
    }
  }
  libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,true);
  return;
}

Assistant:

void KaxCuePoint::PositionSet(const KaxBlockBlob & BlobReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock &BlockReference = BlobReference;

  // fill me
  KaxCueTime & NewTime = GetChild<KaxCueTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = BlockReference.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueTrackPositions & NewPositions = AddNewChild<KaxCueTrackPositions>(*this);
  KaxCueTrack & TheTrack = GetChild<KaxCueTrack>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheTrack) = BlockReference.TrackNum();

  KaxCueClusterPosition & TheClustPos = GetChild<KaxCueClusterPosition>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheClustPos) = BlockReference.ClusterPosition();

#if 0 // MATROSKA_VERSION >= 2
  // handle reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      KaxCueReference & NewRefs = AddNewChild<KaxCueReference>(NewPositions);
      NewRefs.AddReference(BlockReference.Reference(i).RefBlock(), GlobalTimecodeScale);
    }
  }
#endif // MATROSKA_VERSION

#if MATROSKA_VERSION >= 2
  if (!BlobReference.IsSimpleBlock()) {
    const KaxBlockGroup &BlockGroup = BlobReference;
    const KaxCodecState *CodecState = static_cast<KaxCodecState *>(BlockGroup.FindFirstElt(EBML_INFO(KaxCodecState)));
    if (CodecState != NULL) {
      KaxCueCodecState &CueCodecState = AddNewChild<KaxCueCodecState>(NewPositions);
      *static_cast<EbmlUInteger*>(&CueCodecState) = BlockGroup.GetParentCluster()->GetParentSegment()->GetRelativePosition(CodecState->GetElementPosition());
    }
  }
#endif // MATROSKA_VERSION

  SetValueIsSet();
}